

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

int __thiscall Lodtalk::StackInterpreterProxy::returnFloat(StackInterpreterProxy *this,double value)

{
  double value_local;
  StackInterpreterProxy *this_local;
  
  StackInterpreter::pushFloatObject(this->interpreter,value);
  StackInterpreter::returnTop(this->interpreter);
  return 0;
}

Assistant:

int StackInterpreterProxy::returnFloat(double value)
{
    interpreter->pushFloatObject(value);
    interpreter->returnTop();
    return 0;
}